

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O3

void advance_state(upd7759_state *chip)

{
  UINT16 *pUVar1;
  INT8 IVar2;
  UINT8 UVar3;
  uint uVar4;
  UINT8 *pUVar5;
  ulong uVar6;
  char cVar7;
  byte bVar8;
  
  cVar7 = chip->state;
  switch(cVar7) {
  case '\0':
    chip->clocks_left = 4;
    cVar7 = '\0';
    break;
  case '\x01':
    if (chip->mode != 1) {
LAB_00165ffa:
      chip->drq = '\0';
      chip->clocks_left = chip->post_drq_clocks;
      cVar7 = chip->post_drq_state;
      goto LAB_00166007;
    }
    bVar8 = chip->dbuf_pos_read;
    if (bVar8 != chip->dbuf_pos_write) {
      chip->fifo_in = chip->data_buf[bVar8];
      chip->dbuf_pos_read = bVar8 + 1 & 0x3f;
      goto LAB_00165ffa;
    }
    emu_logf(&chip->logger,'\x04',"reading empty FIFO!\n");
    if (1 < chip->drq) goto LAB_00165ffa;
    chip->drq = chip->drq + 1;
    goto LAB_00166024;
  case '\x02':
    if (chip->rom == (UINT8 *)0x0) {
      UVar3 = '\x10';
    }
    else {
      UVar3 = chip->fifo_in;
    }
    chip->req_sample = UVar3;
    chip->clocks_left = 0x46;
    chip->state = '\x03';
    cVar7 = '\x03';
    break;
  case '\x03':
    chip->drq = '\x01';
    chip->clocks_left = 0x2c;
    chip->state = '\x04';
    cVar7 = '\x04';
    break;
  case '\x04':
    pUVar5 = &chip->fifo_in;
    if (chip->rom != (UINT8 *)0x0) {
      pUVar5 = chip->rom;
    }
    bVar8 = *pUVar5;
    chip->last_sample = bVar8;
    chip->drq = '\x01';
    chip->clocks_left = 0x1c;
    cVar7 = (chip->req_sample <= bVar8) * '\x05';
LAB_00166007:
    chip->state = cVar7;
    break;
  case '\x05':
    chip->drq = '\x01';
    chip->clocks_left = 0x20;
    chip->state = '\x06';
    cVar7 = '\x06';
    break;
  case '\x06':
    if (chip->rom == (UINT8 *)0x0) {
      pUVar5 = &chip->fifo_in;
    }
    else {
      pUVar5 = chip->rom + (ulong)chip->req_sample * 2 + 5;
    }
    chip->offset = (uint)*pUVar5 << (chip->sample_offset_shift + 8 & 0x1f);
    chip->drq = '\x01';
    chip->clocks_left = 0x2c;
    chip->state = '\a';
    cVar7 = '\a';
    break;
  case '\a':
    if (chip->rom == (UINT8 *)0x0) {
      pUVar5 = &chip->fifo_in;
    }
    else {
      pUVar5 = chip->rom + (ulong)chip->req_sample * 2 + 6;
    }
    uVar4 = (uint)*pUVar5 << (chip->sample_offset_shift & 0x1f) | chip->offset;
    chip->offset = uVar4;
    if (chip->rommask < uVar4) {
      emu_logf(&chip->logger,'\x04',"offset %X > rommask %X\n",(ulong)uVar4);
    }
    chip->drq = '\x01';
    chip->clocks_left = 0x24;
    chip->state = '\b';
    cVar7 = '\b';
    break;
  case '\b':
    chip->offset = chip->offset + 1;
    chip->first_valid_header = '\0';
    chip->drq = '\x01';
    chip->clocks_left = 0x24;
    goto LAB_00165e78;
  case '\t':
    if (chip->repeat_count != '\0') {
      chip->repeat_count = chip->repeat_count + 0xff;
      chip->offset = chip->repeat_offset;
    }
    if (chip->rom == (UINT8 *)0x0) {
      chip->block_header = chip->fifo_in;
      chip->drq = '\x01';
      (*(code *)(&DAT_00181ad4 + *(int *)(&DAT_00181ad4 + (ulong)(chip->fifo_in >> 6) * 4)))();
      return;
    }
    uVar4 = chip->offset;
    chip->offset = uVar4 + 1;
    bVar8 = chip->rom[uVar4 & chip->rommask];
    chip->block_header = bVar8;
    chip->drq = '\x01';
    (*(code *)(&DAT_00181ad4 + *(int *)(&DAT_00181ad4 + (ulong)(bVar8 >> 6) * 4)))();
    return;
  case '\n':
    if (chip->rom == (UINT8 *)0x0) {
      pUVar5 = &chip->fifo_in;
    }
    else {
      uVar4 = chip->offset;
      chip->offset = uVar4 + 1;
      pUVar5 = chip->rom + (uVar4 & chip->rommask);
    }
    chip->nibbles_left = *pUVar5 + 1;
    chip->drq = '\x01';
    chip->clocks_left = 0x24;
LAB_00165f7c:
    chip->state = '\v';
    cVar7 = '\v';
    break;
  case '\v':
    if (chip->rom == (UINT8 *)0x0) {
      pUVar5 = &chip->fifo_in;
    }
    else {
      uVar4 = chip->offset;
      chip->offset = uVar4 + 1;
      pUVar5 = chip->rom + (uVar4 & chip->rommask);
    }
    bVar8 = *pUVar5;
    chip->adpcm_data = bVar8;
    bVar8 = bVar8 >> 4;
    chip->sample = chip->sample + (short)upd7759_step[chip->adpcm_state][bVar8];
    bVar8 = (char)upd7759_state_table[bVar8] + chip->adpcm_state;
    chip->adpcm_state = bVar8;
    if ((char)bVar8 < '\0') {
      IVar2 = '\0';
LAB_00165e3d:
      chip->adpcm_state = IVar2;
    }
    else {
      IVar2 = '\x0f';
      if (0xf < bVar8) goto LAB_00165e3d;
    }
    chip->drq = '\x01';
    chip->clocks_left = (uint)chip->sample_rate << 2;
    pUVar1 = &chip->nibbles_left;
    *pUVar1 = *pUVar1 - 1;
    if (*pUVar1 == 0) goto LAB_00165e78;
    chip->state = '\f';
    cVar7 = '\f';
    break;
  case '\f':
    uVar6 = (ulong)((chip->adpcm_data & 0xf) << 2);
    chip->sample = chip->sample + *(short *)((long)upd7759_step[chip->adpcm_state] + uVar6);
    bVar8 = *(char *)((long)upd7759_state_table + uVar6) + chip->adpcm_state;
    chip->adpcm_state = bVar8;
    if ((char)bVar8 < '\0') {
      IVar2 = '\0';
LAB_00165e61:
      chip->adpcm_state = IVar2;
    }
    else {
      IVar2 = '\x0f';
      if (0xf < bVar8) goto LAB_00165e61;
    }
    chip->clocks_left = (uint)chip->sample_rate << 2;
    pUVar1 = &chip->nibbles_left;
    *pUVar1 = *pUVar1 - 1;
    if (*pUVar1 != 0) goto LAB_00165f7c;
LAB_00165e78:
    chip->state = '\t';
    cVar7 = '\t';
  }
  if (chip->drq != '\0') {
    chip->post_drq_state = cVar7;
    chip->post_drq_clocks = chip->clocks_left + -0x15;
    chip->state = '\x01';
LAB_00166024:
    chip->clocks_left = 0x15;
  }
  return;
}

Assistant:

static void advance_state(upd7759_state *chip)
{
	switch (chip->state)
	{
		/* Idle state: we stick around here while there's nothing to do */
		case STATE_IDLE:
			chip->clocks_left = 4;
			break;

		/* drop DRQ state: update to the intended state */
		case STATE_DROP_DRQ:
			if (chip->mode == MODE_SLAVE) // Slave Mode only
			{
				UINT8 fail = get_fifo_data(chip);
				if (fail)
				{
					if (chip->drq < 2)	// up to 2 attempts at waiting for the data
					{
						chip->drq ++;
						chip->clocks_left = 21;
						return;
					}
				}
			}

			chip->drq = 0;

			chip->clocks_left = chip->post_drq_clocks;
			chip->state = chip->post_drq_state;
			break;

		/* Start state: we begin here as soon as a sample is triggered */
		case STATE_START:
			chip->req_sample = chip->rom ? chip->fifo_in : 0x10;
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "req_sample = %02X\n", chip->req_sample);

			/* 35+ cycles after we get here, the /DRQ goes low
			 *     (first byte (number of samples in ROM) should be sent in response)
			 *
			 * (35 is the minimum number of cycles I found during heavy tests.
			 * Depending on the state the chip was in just before the /MD was set to 0 (reset, standby
			 * or just-finished-playing-previous-sample) this number can range from 35 up to ~24000).
			 * It also varies slightly from test to test, but not much - a few cycles at most.) */
			chip->clocks_left = 70; /* 35 - breaks cotton */
			chip->state = STATE_FIRST_REQ;
			break;

		/* First request state: issue a request for the first byte */
		/* The expected response will be the index of the last sample */
		case STATE_FIRST_REQ:
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "first data request\n");
			chip->drq = 1;

			/* 44 cycles later, we will latch this value and request another byte */
			chip->clocks_left = 44;
			chip->state = STATE_LAST_SAMPLE;
			break;

		/* Last sample state: latch the last sample value and issue a request for the second byte */
		/* The second byte read will be just a dummy */
		case STATE_LAST_SAMPLE:
			chip->last_sample = chip->rom ? chip->rom[0] : chip->fifo_in;
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "last_sample = %02X, requesting dummy 1\n", chip->last_sample);
			chip->drq = 1;

			/* 28 cycles later, we will latch this value and request another byte */
			chip->clocks_left = 28; /* 28 - breaks cotton */
			chip->state = (chip->req_sample > chip->last_sample) ? STATE_IDLE : STATE_DUMMY1;
			break;

		/* First dummy state: ignore any data here and issue a request for the third byte */
		/* The expected response will be the MSB of the sample address */
		case STATE_DUMMY1:
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "dummy1, requesting offset_hi\n");
			chip->drq = 1;

			/* 32 cycles later, we will latch this value and request another byte */
			chip->clocks_left = 32;
			chip->state = STATE_ADDR_MSB;
			break;

		/* Address MSB state: latch the MSB of the sample address and issue a request for the fourth byte */
		/* The expected response will be the LSB of the sample address */
		case STATE_ADDR_MSB:
			chip->offset = (chip->rom ? chip->rom[chip->req_sample * 2 + 5] : chip->fifo_in) << (8 + chip->sample_offset_shift);
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "offset_hi = %02X, requesting offset_lo\n", chip->offset >> (8 + chip->sample_offset_shift));
			chip->drq = 1;

			/* 44 cycles later, we will latch this value and request another byte */
			chip->clocks_left = 44;
			chip->state = STATE_ADDR_LSB;
			break;

		/* Address LSB state: latch the LSB of the sample address and issue a request for the fifth byte */
		/* The expected response will be just a dummy */
		case STATE_ADDR_LSB:
			chip->offset |= (chip->rom ? chip->rom[chip->req_sample * 2 + 6] : chip->fifo_in) << chip->sample_offset_shift;
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "offset_lo = %02X, requesting dummy 2\n", (chip->offset >> chip->sample_offset_shift) & 0xff);
			if (chip->offset > chip->rommask) emu_logf(&chip->logger, DEVLOG_DEBUG, "offset %X > rommask %X\n",chip->offset, chip->rommask);
			chip->drq = 1;

			/* 36 cycles later, we will latch this value and request another byte */
			chip->clocks_left = 36;
			chip->state = STATE_DUMMY2;
			break;

		/* Second dummy state: ignore any data here and issue a request for the the sixth byte */
		/* The expected response will be the first block header */
		case STATE_DUMMY2:
			chip->offset++;
			chip->first_valid_header = 0;
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "dummy2, requesting block header\n");
			chip->drq = 1;

			/* 36?? cycles later, we will latch this value and request another byte */
			chip->clocks_left = 36;
			chip->state = STATE_BLOCK_HEADER;
			break;

		/* Block header state: latch the header and issue a request for the first byte afterwards */
		case STATE_BLOCK_HEADER:

			/* if we're in a repeat loop, reset the offset to the repeat point and decrement the count */
			if (chip->repeat_count)
			{
				chip->repeat_count--;
				chip->offset = chip->repeat_offset;
			}
			chip->block_header = chip->rom ? chip->rom[chip->offset++ & chip->rommask] : chip->fifo_in;
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "header (@%05X) = %02X, requesting next byte\n", chip->offset, chip->block_header);
			chip->drq = 1;

			/* our next step depends on the top two bits */
			switch (chip->block_header & 0xc0)
			{
				case 0x00:  /* silence */
					chip->clocks_left = 1024 * ((chip->block_header & 0x3f) + 1);
					chip->state = (chip->block_header == 0 && chip->first_valid_header) ? STATE_IDLE : STATE_BLOCK_HEADER;
					chip->sample = 0;
					chip->adpcm_state = 0;
					break;

				case 0x40:  /* 256 nibbles */
					chip->sample_rate = (chip->block_header & 0x3f) + 1;
					chip->nibbles_left = 256;
					chip->clocks_left = 36; /* just a guess */
					chip->state = STATE_NIBBLE_MSN;
					break;

				case 0x80:  /* n nibbles */
					chip->sample_rate = (chip->block_header & 0x3f) + 1;
					chip->clocks_left = 36; /* just a guess */
					chip->state = STATE_NIBBLE_COUNT;
					break;

				case 0xc0:  /* repeat loop */
					chip->repeat_count = (chip->block_header & 7) + 1;
					chip->repeat_offset = chip->offset;
					chip->clocks_left = 36; /* just a guess */
					chip->state = STATE_BLOCK_HEADER;
					break;
			}

			/* set a flag when we get the first non-zero header */
			if (chip->block_header != 0)
				chip->first_valid_header = 1;
			break;

		/* Nibble count state: latch the number of nibbles to play and request another byte */
		/* The expected response will be the first data byte */
		case STATE_NIBBLE_COUNT:
			chip->nibbles_left = (chip->rom ? chip->rom[chip->offset++ & chip->rommask] : chip->fifo_in) + 1;
			if (DEBUG_STATES) emu_logf(&chip->logger, DEVLOG_TRACE, "nibble_count = %u, requesting next byte\n", (unsigned)chip->nibbles_left);
			chip->drq = 1;

			/* 36?? cycles later, we will latch this value and request another byte */
			chip->clocks_left = 36; /* just a guess */
			chip->state = STATE_NIBBLE_MSN;
			break;

		/* MSN state: latch the data for this pair of samples and request another byte */
		/* The expected response will be the next sample data or another header */
		case STATE_NIBBLE_MSN:
			chip->adpcm_data = chip->rom ? chip->rom[chip->offset++ & chip->rommask] : chip->fifo_in;
			update_adpcm(chip, chip->adpcm_data >> 4);
			chip->drq = 1;

			/* we stay in this state until the time for this sample is complete */
			chip->clocks_left = chip->sample_rate * 4;
			if (--chip->nibbles_left == 0)
				chip->state = STATE_BLOCK_HEADER;
			else
				chip->state = STATE_NIBBLE_LSN;
			break;

		/* LSN state: process the lower nibble */
		case STATE_NIBBLE_LSN:
			update_adpcm(chip, chip->adpcm_data & 15);

			/* we stay in this state until the time for this sample is complete */
			chip->clocks_left = chip->sample_rate * 4;
			if (--chip->nibbles_left == 0)
				chip->state = STATE_BLOCK_HEADER;
			else
				chip->state = STATE_NIBBLE_MSN;
			break;
	}

	/* if there's a DRQ, fudge the state */
	if (chip->drq)
	{
		chip->post_drq_state = chip->state;
		chip->post_drq_clocks = chip->clocks_left - 21;
		chip->state = STATE_DROP_DRQ;
		chip->clocks_left = 21;
	}
}